

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

uint32_t lyjson_exp_number_copy_num_part
                   (char *num,uint32_t num_len,char *dec_point,int32_t dp_position,char *dst)

{
  uint local_48;
  uint32_t local_3c;
  uint local_38;
  int32_t d;
  int32_t n;
  int32_t dec_point_idx;
  char *dst_local;
  int32_t dp_position_local;
  char *dec_point_local;
  uint32_t num_len_local;
  char *num_local;
  
  if ((num == (char *)0x0) || (dst == (char *)0x0)) {
    __assert_fail("num && dst",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x196,
                  "uint32_t lyjson_exp_number_copy_num_part(const char *, uint32_t, char *, int32_t, char *)"
                 );
  }
  if (dec_point == (char *)0x0) {
    local_48 = 0x7fffffff;
  }
  else {
    local_48 = (int)dec_point - (int)num;
  }
  if ((-1 < (int)local_48) && (local_48 != dp_position)) {
    local_3c = 0;
    for (local_38 = 0; local_38 < num_len; local_38 = local_38 + 1) {
      if (local_38 != local_48) {
        if (local_3c == dp_position) {
          dst[(int)local_3c] = '.';
          dst[(int)(local_3c + 1)] = num[(int)local_38];
          local_3c = local_3c + 2;
        }
        else {
          dst[(int)local_3c] = num[(int)local_38];
          local_3c = local_3c + 1;
        }
      }
    }
    return local_3c;
  }
  __assert_fail("(dec_point_idx >= 0) && (dec_point_idx != dp_position)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                0x199,
                "uint32_t lyjson_exp_number_copy_num_part(const char *, uint32_t, char *, int32_t, char *)"
               );
}

Assistant:

static uint32_t
lyjson_exp_number_copy_num_part(const char *num, uint32_t num_len, char *dec_point, int32_t dp_position, char *dst)
{
    int32_t dec_point_idx;
    int32_t n, d;

    assert(num && dst);

    dec_point_idx = dec_point ? dec_point - num : INT32_MAX;
    assert((dec_point_idx >= 0) && (dec_point_idx != dp_position));

    for (n = 0, d = 0; (uint32_t)n < num_len; n++) {
        if (n == dec_point_idx) {
            continue;
        } else if (d == dp_position) {
            dst[d++] = '.';
            dst[d++] = num[n];
        } else {
            dst[d++] = num[n];
        }
    }

    return d;
}